

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkAllocVec(ARKodeMem ark_mem,N_Vector tmpl,N_Vector *v)

{
  N_Vector p_Var1;
  int iVar2;
  
  iVar2 = 0;
  if ((tmpl->ops->nvclone != (_func_N_Vector_N_Vector *)0x0) &&
     (tmpl->ops->nvdestroy != (_func_void_N_Vector *)0x0)) {
    if (*v == (N_Vector)0x0) {
      p_Var1 = (N_Vector)N_VClone(tmpl);
      *v = p_Var1;
      if (p_Var1 == (N_Vector)0x0) {
        arkFreeVectors(ark_mem);
        return 0;
      }
      ark_mem->lrw = ark_mem->lrw + ark_mem->lrw1;
      ark_mem->liw = ark_mem->liw + ark_mem->liw1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

sunbooleantype arkAllocVec(ARKodeMem ark_mem, N_Vector tmpl, N_Vector* v)
{
  /* return failure if N_VClone or N_VDestroy is not implemented */
  if ((!tmpl->ops->nvclone) || (!tmpl->ops->nvdestroy)) { return SUNFALSE; }

  /* allocate the new vector if necessary */
  if (*v == NULL)
  {
    *v = N_VClone(tmpl);
    if (*v == NULL)
    {
      arkFreeVectors(ark_mem);
      return (SUNFALSE);
    }
    else
    {
      ark_mem->lrw += ark_mem->lrw1;
      ark_mem->liw += ark_mem->liw1;
    }
  }
  return (SUNTRUE);
}